

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QTextCharFormat>::copyAppend
          (QGenericArrayOps<QTextCharFormat> *this,qsizetype n,parameter_type t)

{
  qsizetype *pqVar1;
  QTextCharFormat *pQVar2;
  bool bVar3;
  
  if (n != 0) {
    pQVar2 = (this->super_QArrayDataPointer<QTextCharFormat>).ptr;
    while (bVar3 = n != 0, n = n + -1, bVar3) {
      QTextFormat::QTextFormat
                (&pQVar2[(this->super_QArrayDataPointer<QTextCharFormat>).size].super_QTextFormat,
                 &t->super_QTextFormat);
      pqVar1 = &(this->super_QArrayDataPointer<QTextCharFormat>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(qsizetype n, parameter_type t)
    {
        Q_ASSERT(!this->isShared() || n == 0);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        if (!n)
            return;

        T *data = this->begin();
        while (n--) {
            new (data + this->size) T(t);
            ++this->size;
        }
    }